

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_rleCompressBlock(void *dst,size_t dstCapacity,BYTE src,size_t srcSize,U32 lastBlock)

{
  U32 cBlockHeader;
  BYTE *op;
  U32 lastBlock_local;
  size_t srcSize_local;
  BYTE src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (dstCapacity < 4) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    MEM_writeLE24(dst,lastBlock + 2 + (int)(srcSize << 3));
    *(BYTE *)((long)dst + 3) = src;
    dst_local = (void *)0x4;
  }
  return (size_t)dst_local;
}

Assistant:

MEM_STATIC size_t ZSTD_rleCompressBlock (void* dst, size_t dstCapacity, BYTE src, size_t srcSize, U32 lastBlock)
{
    BYTE* const op = (BYTE*)dst;
    U32 const cBlockHeader = lastBlock + (((U32)bt_rle)<<1) + (U32)(srcSize << 3);
    RETURN_ERROR_IF(dstCapacity < 4, dstSize_tooSmall, "");
    MEM_writeLE24(op, cBlockHeader);
    op[3] = src;
    return 4;
}